

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_classes.cc
# Opt level: O2

void add_samples(teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 *teacher)

{
  double *pdVar1;
  sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *desired_00;
  long lVar2;
  double (*__first) [3];
  bool bVar3;
  vector<double,_std::allocator<double>_> desired;
  vector<double,_std::allocator<double>_> input;
  sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> local_60;
  
  lVar2 = 3;
  __first = learning_samples;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    pdVar1 = *__first;
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&input,*__first,pdVar1 + 2,
               (allocator_type *)&local_60);
    __first = __first + 1;
    desired_00 = &local_60;
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&desired,pdVar1 + 2,*__first,
               (allocator_type *)&local_60);
    klogic::transform::
    continuous<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<double,std::allocator<double>>>
              (&local_60,(transform *)&input,&desired,
               (vector<double,_std::allocator<double>_> *)desired_00);
    std::
    vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
    ::push_back(&teacher->_samples,&local_60);
    klogic::learning::
    sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::~sample
              (&local_60);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&desired);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&input);
  }
  return;
}

Assistant:

void add_samples(learning::teacher<mlmvn> &teacher) 
{
    for (int i = 0; i < nsamples; ++i) {
        const double *inp_beg = &learning_samples[i][0], *inp_end = inp_beg + 2;
        vector<double> input(inp_beg, inp_end);
        vector<double> desired(inp_beg + 2, inp_beg + 3);

        teacher.add_sample(transform::continuous<cvector>(input, desired));
    }
}